

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stddev.hpp
# Opt level: O0

void duckdb::STDDevBaseOperation::Combine<duckdb::StddevState,duckdb::RegrSXXOperation>
               (StddevState *source,StddevState *target,AggregateInputData *param_3)

{
  uint64_t uVar1;
  double dVar2;
  uint64_t uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double delta;
  double mean;
  double total_count;
  double source_count;
  double target_count;
  uint64_t count;
  AggregateInputData *param_2_local;
  StddevState *target_local;
  StddevState *source_local;
  
  if (target->count == 0) {
    target->count = source->count;
    target->mean = source->mean;
    target->dsquared = source->dsquared;
  }
  else if (source->count != 0) {
    uVar3 = target->count + source->count;
    uVar1 = target->count;
    auVar8._8_4_ = (int)(uVar1 >> 0x20);
    auVar8._0_8_ = uVar1;
    auVar8._12_4_ = 0x45300000;
    dVar4 = (auVar8._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
    uVar1 = source->count;
    auVar9._8_4_ = (int)(uVar1 >> 0x20);
    auVar9._0_8_ = uVar1;
    auVar9._12_4_ = 0x45300000;
    dVar5 = (auVar9._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
    auVar10._8_4_ = (int)(uVar3 >> 0x20);
    auVar10._0_8_ = uVar3;
    auVar10._12_4_ = 0x45300000;
    dVar6 = (auVar10._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0);
    dVar2 = source->mean;
    dVar7 = source->mean - target->mean;
    target->dsquared = source->dsquared + target->dsquared + (dVar7 * dVar7 * dVar5 * dVar4) / dVar6
    ;
    target->mean = (dVar5 * dVar2 + dVar4 * target->mean) / dVar6;
    target->count = uVar3;
  }
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &) {
		if (target.count == 0) {
			target = source;
		} else if (source.count > 0) {
			const auto count = target.count + source.count;
			D_ASSERT(count >= target.count); // This is a check that we are not overflowing
			const double target_count = static_cast<double>(target.count);
			const double source_count = static_cast<double>(source.count);
			const double total_count = static_cast<double>(count);
			const auto mean = (source_count * source.mean + target_count * target.mean) / total_count;
			const auto delta = source.mean - target.mean;
			target.dsquared =
			    source.dsquared + target.dsquared + delta * delta * source_count * target_count / total_count;
			target.mean = mean;
			target.count = count;
		}
	}